

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_udp_sockets.hpp
# Opt level: O0

void __thiscall
libtorrent::aux::session_udp_socket::session_udp_socket
          (session_udp_socket *this,io_context *ios,listen_socket_handle *ls)

{
  listen_socket_handle local_30;
  listen_socket_handle *local_20;
  listen_socket_handle *ls_local;
  io_context *ios_local;
  session_udp_socket *this_local;
  
  local_20 = ls;
  ls_local = (listen_socket_handle *)ios;
  ios_local = (io_context *)this;
  listen_socket_handle::listen_socket_handle(&local_30,ls);
  udp_socket::udp_socket(&this->sock,ios,&local_30);
  listen_socket_handle::~listen_socket_handle(&local_30);
  this->write_blocked = false;
  return;
}

Assistant:

explicit session_udp_socket(io_context& ios, listen_socket_handle ls)
			: sock(ios, std::move(ls)) {}